

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

QSize __thiscall QCalendarWidget::minimumSizeHint(QCalendarWidget *this)

{
  long lVar1;
  long lVar2;
  QCalendarModel *pQVar3;
  QWidgetData *pQVar4;
  bool bVar5;
  int iVar6;
  DayOfWeek day;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QStyle *pQVar11;
  long lVar12;
  QHeaderView *pQVar13;
  int extraout_var;
  int extraout_EDX;
  uint extraout_EDX_00;
  int extraout_EDX_01;
  int i;
  int iVar14;
  int j;
  int iVar15;
  QSize QVar16;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QMargins QVar17;
  int local_f4;
  int local_e0;
  int local_dc;
  QLocale local_b8;
  QFontMetrics fm;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  QFontMetrics fm_3;
  QStyleOption option;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  if ((*(int *)(lVar2 + 0x2d4) < 0) || (*(int *)(lVar2 + 0x2d8) < 0)) {
    QWidget::ensurePolished(&this->super_QWidget);
    option.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    option._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    option.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    iVar14 = 1;
    local_f4 = 0;
    QStyleOption::QStyleOption(&option,1,0);
    QStyleOption::initFrom(&option,&this->super_QWidget);
    pQVar11 = QWidget::style(&this->super_QWidget);
    iVar6 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x41,&option,this);
    iVar6 = iVar6 * 2 + 2;
    lVar12 = *(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600);
    if (*(int *)(lVar12 + 0x44) == 0) {
      local_e0 = 6;
      iVar15 = 0;
    }
    else {
      local_f4 = 0;
      iVar15 = 0;
      for (; iVar14 != 8; iVar14 = iVar14 + 1) {
        _fm = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivate::QCalendarModel::formatForCell
                  ((QTextCharFormat *)&fm_3,*(QCalendarModel **)(lVar2 + 600),0,iVar14);
        QTextCharFormat::font();
        QFontMetrics::QFontMetrics(&fm,(QFont *)local_a8);
        QFont::~QFont((QFont *)local_a8);
        QTextFormat::~QTextFormat((QTextFormat *)&fm_3);
        pQVar3 = *(QCalendarModel **)(lVar2 + 600);
        day = QtPrivate::QCalendarModel::dayOfWeekForColumn(pQVar3,iVar14);
        QtPrivate::QCalendarModel::dayName((QString *)local_a8,pQVar3,day);
        iVar7 = QFontMetrics::horizontalAdvance
                          ((QString *)&fm,(int)(QArrayDataPointer<char16_t> *)local_a8);
        if (iVar15 <= iVar7 + iVar6) {
          iVar15 = iVar7 + iVar6;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
        iVar7 = QFontMetrics::height();
        if (local_f4 <= iVar7) {
          local_f4 = iVar7;
        }
        QFontMetrics::~QFontMetrics(&fm);
      }
      lVar12 = *(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600);
      local_e0 = 7;
    }
    if (*(char *)(lVar12 + 0x48) == '\0') {
      local_dc = 7;
    }
    else {
      local_dc = 8;
      for (iVar14 = 1; iVar14 != 7; iVar14 = iVar14 + 1) {
        _fm = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivate::QCalendarModel::formatForCell
                  ((QTextCharFormat *)&fm_3,*(QCalendarModel **)(lVar2 + 600),iVar14,0);
        QTextCharFormat::font();
        QFontMetrics::QFontMetrics(&fm,(QFont *)local_a8);
        QFont::~QFont((QFont *)local_a8);
        QTextFormat::~QTextFormat((QTextFormat *)&fm_3);
        for (iVar7 = 1; iVar7 != 0x35; iVar7 = iVar7 + 1) {
          iVar8 = (int)(QArrayDataPointer<char16_t> *)local_a8;
          QString::number(iVar8,iVar7);
          iVar8 = QFontMetrics::horizontalAdvance((QString *)&fm,iVar8);
          if (iVar15 <= iVar8 + iVar6) {
            iVar15 = iVar8 + iVar6;
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
        }
        iVar7 = QFontMetrics::height();
        if (local_f4 <= iVar7) {
          local_f4 = iVar7;
        }
        QFontMetrics::~QFontMetrics(&fm);
      }
    }
    _fm = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::QCalendarModel::formatForCell
              ((QTextCharFormat *)&fm_3,*(QCalendarModel **)(lVar2 + 600),1,1);
    QTextCharFormat::font();
    QFontMetrics::QFontMetrics(&fm,(QFont *)local_a8);
    QFont::~QFont((QFont *)local_a8);
    QTextFormat::~QTextFormat((QTextFormat *)&fm_3);
    for (iVar14 = 1; iVar14 != 0x36; iVar14 = iVar14 + 1) {
      iVar7 = (int)(QArrayDataPointer<char16_t> *)local_a8;
      QString::number(iVar7,iVar14);
      iVar7 = QFontMetrics::horizontalAdvance((QString *)&fm,iVar7);
      if (iVar15 <= iVar7 + iVar6) {
        iVar15 = iVar7 + iVar6;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
      iVar7 = QFontMetrics::height();
      if (local_f4 <= iVar7) {
        local_f4 = iVar7;
      }
    }
    bVar5 = QTableView::showGrid(*(QTableView **)(lVar2 + 0x260));
    local_f4 = local_f4 + (uint)bVar5;
    iVar6 = iVar15 + (uint)bVar5 + 1;
    pQVar13 = QTableView::verticalHeader(*(QTableView **)(lVar2 + 0x260));
    iVar14 = QHeaderView::minimumSectionSize(pQVar13);
    if (local_f4 <= iVar14) {
      local_f4 = iVar14;
    }
    pQVar13 = QTableView::horizontalHeader(*(QTableView **)(lVar2 + 0x260));
    iVar14 = QHeaderView::minimumSectionSize(pQVar13);
    if (iVar14 < iVar6) {
      iVar14 = iVar6;
    }
    iVar15 = 0;
    iVar6 = 0;
    if (*(char *)(lVar2 + 0x2d0) != '\0') {
      (**(code **)(**(long **)(lVar2 + 0x2c0) + 0x70))();
      iVar7 = (**(code **)(**(long **)(lVar2 + 0x290) + 0x70))();
      iVar8 = (**(code **)(**(long **)(lVar2 + 0x288) + 0x70))();
      _fm_3 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
      QWidget::fontMetrics((QWidget *)&fm_3);
      iVar15 = 0;
      for (iVar6 = 1; iVar6 != 0xc; iVar6 = iVar6 + 1) {
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pQVar3 = *(QCalendarModel **)(lVar2 + 600);
        QWidget::locale(&local_b8,&this->super_QWidget);
        QtPrivate::QCalendarModel::monthName((QString *)local_a8,pQVar3,&local_b8,iVar6);
        QLocale::~QLocale(&local_b8);
        iVar9 = QFontMetrics::boundingRect((QString *)&fm_3);
        iVar9 = (extraout_EDX - iVar9) + 1;
        if (iVar9 < iVar15) {
          iVar9 = iVar15;
        }
        iVar15 = iVar9;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
      }
      iVar6 = (**(code **)(**(long **)(lVar2 + 0x298) + 0x70))();
      QAbstractButton::text((QString *)local_a8,*(QAbstractButton **)(lVar2 + 0x298));
      iVar9 = QFontMetrics::boundingRect((QString *)&fm_3);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
      QWidget::fontMetrics((QWidget *)local_a8);
      pQVar4 = _fm_3;
      _fm_3 = (QWidgetData *)local_a8._0_8_;
      local_a8._0_8_ = pQVar4;
      QFontMetrics::~QFontMetrics((QFontMetrics *)local_a8);
      latin1.m_data = "5555";
      latin1.m_size = 4;
      QString::QString((QString *)local_a8,latin1);
      iVar10 = QFontMetrics::boundingRect((QString *)&fm_3);
      iVar15 = ((iVar8 + iVar7 + iVar15 + (~extraout_EDX_00 + iVar9 + iVar6) * 2 + extraout_EDX_01)
               - iVar10) + 1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
      QFontMetrics::~QFontMetrics(&fm_3);
      iVar6 = extraout_var;
    }
    iVar7 = iVar14 * local_dc;
    if (iVar14 * local_dc < iVar15) {
      iVar7 = iVar15;
    }
    QVar17 = QWidget::contentsMargins(&this->super_QWidget);
    QVar16.wd.m_i = iVar7 + QVar17.m_right.m_i.m_i + QVar17.m_left.m_i.m_i;
    QVar16.ht.m_i = QVar17.m_bottom.m_i.m_i + iVar6 + QVar17.m_top.m_i.m_i + local_f4 * local_e0;
    *(QSize *)(lVar2 + 0x2d4) = QVar16;
    QFontMetrics::~QFontMetrics(&fm);
    QStyleOption::~QStyleOption(&option);
  }
  else {
    QVar16 = *(QSize *)(lVar2 + 0x2d4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar16;
  }
  __stack_chk_fail();
}

Assistant:

QSize QCalendarWidget::minimumSizeHint() const
{
    Q_D(const QCalendarWidget);
    if (d->cachedSizeHint.isValid())
        return d->cachedSizeHint;

    ensurePolished();

    int w = 0;
    int h = 0;

    int end = 53;
    int rows = 7;
    int cols = 8;

    QStyleOption option;
    option.initFrom(this);
    const int marginH = (style()->pixelMetric(QStyle::PM_FocusFrameHMargin, &option, this) + 1) * 2;

    if (horizontalHeaderFormat() == QCalendarWidget::NoHorizontalHeader) {
        rows = 6;
    } else {
        for (int i = 1; i <= 7; i++) {
            QFontMetrics fm(d->m_model->formatForCell(0, i).font());
            w = qMax(w, fm.horizontalAdvance(d->m_model->dayName(d->m_model->dayOfWeekForColumn(i))) + marginH);
            h = qMax(h, fm.height());
        }
    }

    if (verticalHeaderFormat() == QCalendarWidget::NoVerticalHeader) {
        cols = 7;
    } else {
        for (int i = 1; i <= 6; i++) {
            QFontMetrics fm(d->m_model->formatForCell(i, 0).font());
            for (int j = 1; j < end; j++)
                w = qMax(w, fm.horizontalAdvance(QString::number(j)) + marginH);
            h = qMax(h, fm.height());
        }
    }

    QFontMetrics fm(d->m_model->formatForCell(1, 1).font());
    for (int i = 1; i <= end; i++) {
        w = qMax(w, fm.horizontalAdvance(QString::number(i)) + marginH);
        h = qMax(h, fm.height());
    }

    if (d->m_view->showGrid()) {
        // hardcoded in tableview
        w += 1;
        h += 1;
    }

    w += 1; // default column span

    h = qMax(h, d->m_view->verticalHeader()->minimumSectionSize());
    w = qMax(w, d->m_view->horizontalHeader()->minimumSectionSize());

    //add the size of the header.
    QSize headerSize(0, 0);
    if (d->navBarVisible) {
        int headerH = d->navBarBackground->sizeHint().height();
        int headerW = 0;

        headerW += d->prevMonth->sizeHint().width();
        headerW += d->nextMonth->sizeHint().width();

        QFontMetrics fm = d->monthButton->fontMetrics();
        int monthW = 0;
        for (int i = 1; i < 12; i++) {
            QString monthName = d->m_model->monthName(locale(), i);
            monthW = qMax(monthW, fm.boundingRect(monthName).width());
        }
        const int buttonDecoMargin = d->monthButton->sizeHint().width() - fm.boundingRect(d->monthButton->text()).width();
        headerW += monthW + buttonDecoMargin;

        fm = d->yearButton->fontMetrics();
        headerW += fm.boundingRect("5555"_L1).width() + buttonDecoMargin;

        headerSize = QSize(headerW, headerH);
    }
    w *= cols;
    w = qMax(headerSize.width(), w);
    h = (h * rows) + headerSize.height();
    QMargins cm = contentsMargins();
    w += cm.left() + cm.right();
    h += cm.top() + cm.bottom();
    d->cachedSizeHint = QSize(w, h);
    return d->cachedSizeHint;
}